

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void speak_async(OpenJTalk *oj)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  undefined1 auVar4 [16];
  PaError err;
  PaStream *stream;
  PaStreamParameters outputParameters;
  uint in_stack_ffffffffffffffc8;
  undefined8 local_30;
  int local_28 [4];
  undefined8 local_18;
  undefined8 local_10;
  
  if (g_verbose) {
    if (g_psd->counter == 0) {
      console_message((char *)0x196f72);
    }
    else {
      console_message((char *)0x196f80);
    }
  }
  g_psd->finished = false;
  g_psd->speaking = false;
  g_psd->pause = false;
  g_psd->paused = false;
  g_psd->stop = false;
  local_28[0] = Pa_GetDefaultOutputDevice();
  if (local_28[0] != -1) {
    local_28[1] = 1;
    local_28[2] = 8;
    local_28[3] = 0;
    lVar3 = Pa_GetDeviceInfo(local_28[0]);
    local_18 = *(undefined8 *)(lVar3 + 0x28);
    local_10 = 0;
    sVar1 = g_psd->sampling_frequency;
    auVar4._8_4_ = (int)(sVar1 >> 0x20);
    auVar4._0_8_ = sVar1;
    auVar4._12_4_ = 0x45300000;
    iVar2 = Pa_OpenStream((auVar4._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0),&local_30,0
                          ,local_28,0x400,1,speak_pa_callback,g_psd);
    if ((iVar2 == 0) &&
       (iVar2 = Pa_SetStreamFinishedCallback(local_30,speak_pa_finished), iVar2 == 0)) {
      g_psd->speaking = true;
      iVar2 = Pa_StartStream(local_30);
      if (iVar2 == 0) {
        sleep_internal((ulong)in_stack_ffffffffffffffc8);
        return;
      }
    }
  }
  if (g_psd->data != (short *)0x0) {
    free(g_psd->data);
    g_psd->data = (short *)0x0;
  }
  g_psd->finished = true;
  g_psd->speaking = false;
  g_psd->pause = false;
  g_psd->paused = false;
  g_psd->stop = false;
  return;
}

Assistant:

void speak_async(OpenJTalk *oj)
{
	if (g_verbose)
	{
		if (g_psd->counter == 0)
		{
			console_message(u8"非同期発声開始！\n");
		}
		else
		{
			console_message(u8"非同期発声再開\n");
		}
	}

	g_psd->finished = false;
	g_psd->speaking = false;
	g_psd->pause = false;
	g_psd->paused = false;
	g_psd->stop = false;

	PaStreamParameters outputParameters;
	PaStream *stream;
	PaError err;

	outputParameters.device = Pa_GetDefaultOutputDevice();
	if (outputParameters.device == paNoDevice)
	{
		goto exit_func;
	}
	outputParameters.channelCount = 1;
	outputParameters.sampleFormat = paInt16;
	outputParameters.suggestedLatency = Pa_GetDeviceInfo(outputParameters.device)->defaultLowOutputLatency;
	outputParameters.hostApiSpecificStreamInfo = NULL;

	err = Pa_OpenStream(
		&stream,
		NULL,
		&outputParameters,
		(double)g_psd->sampling_frequency,
		OPENJTALK_BLOCKSIZE,
		paClipOff,
		speak_pa_callback,
		g_psd);
	if (err != paNoError)
	{
		goto exit_func;
	}

	err = Pa_SetStreamFinishedCallback(stream, &speak_pa_finished);
	if (err != paNoError)
	{
		goto exit_func;
	}

	g_psd->speaking = true;
	err = Pa_StartStream(stream);
	if (err != paNoError)
	{
		goto exit_func;
	}

	sleep_internal(100);
	return;

exit_func:
	if (g_psd->data)
	{
		free(g_psd->data);
		g_psd->data = NULL;
	}
	g_psd->finished = true;
	g_psd->speaking = false;
	g_psd->pause = false;
	g_psd->paused = false;
	g_psd->stop = false;

	return;
}